

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sclLiberty.c
# Opt level: O3

int Scl_LibertyBuildItem(Scl_Tree_t *p,char **ppPos,char *pEnd)

{
  char cVar1;
  uint uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  char *pcVar6;
  char *pcVar7;
  char *pcVar8;
  Scl_Pair_t SVar9;
  long lVar10;
  byte bVar11;
  Scl_Item_t *pSVar12;
  byte *pbVar13;
  ulong uVar14;
  byte *pbVar15;
  long lVar16;
  byte *pbVar17;
  byte *pbVar18;
  ulong uVar19;
  
  pbVar17 = (byte *)*ppPos;
  do {
    pbVar18 = pbVar17;
    if (pbVar17 < pEnd) {
      do {
        bVar11 = *pbVar17;
        if (bVar11 == 10) {
          p->nLines = p->nLines + 1;
          bVar11 = *pbVar17;
        }
      } while ((((bVar11 < 0x21) && ((0x100002600U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) ||
               (pbVar18 = pbVar17, bVar11 == 0x5c)) &&
              (pbVar17 = pbVar17 + 1, pbVar18 = (byte *)pEnd, pbVar17 != (byte *)pEnd));
    }
    *ppPos = (char *)pbVar18;
    if (pbVar18 == (byte *)pEnd) {
      return -2;
    }
    if (*pbVar18 == 0x22) {
      pbVar17 = pbVar18 + 1;
      do {
        pbVar15 = pbVar17;
        if (pEnd <= pbVar17) break;
        pbVar15 = pbVar17 + 1;
        bVar11 = *pbVar17;
        pbVar17 = pbVar15;
      } while (bVar11 != 0x22);
    }
    else {
      pbVar15 = pbVar18;
      pbVar17 = pbVar18;
      if (pbVar18 < pEnd) {
        while( true ) {
          bVar11 = *pbVar17;
          pbVar15 = pbVar17;
          if (((ulong)bVar11 < 0x3c) && ((0xc00030100002600U >> ((ulong)bVar11 & 0x3f) & 1) != 0))
          break;
          if ((bVar11 == 0x7b) ||
             ((bVar11 == 0x7d ||
              (pbVar17 = pbVar17 + 1, pbVar15 = (byte *)pEnd, pbVar17 == (byte *)pEnd)))) break;
        }
      }
    }
    pcVar8 = p->pContents;
    *ppPos = (char *)pbVar15;
    if (pbVar15 == (byte *)pEnd) {
      uVar19 = (long)pbVar18 - (long)pcVar8;
      lVar16 = 0;
      goto LAB_003e4896;
    }
    pbVar17 = pbVar15;
    pbVar13 = pbVar15;
    if (pbVar15 < pEnd) {
      do {
        bVar11 = *pbVar13;
        if (bVar11 == 10) {
          p->nLines = p->nLines + 1;
          bVar11 = *pbVar13;
        }
      } while ((((bVar11 < 0x21) && ((0x100002600U >> ((ulong)bVar11 & 0x3f) & 1) != 0)) ||
               (pbVar17 = pbVar13, bVar11 == 0x5c)) &&
              (pbVar13 = pbVar13 + 1, pbVar17 = (byte *)pEnd, pbVar13 != (byte *)pEnd));
    }
    pcVar6 = p->pContents;
    *ppPos = (char *)pbVar17;
    if (pbVar17 == (byte *)pEnd) goto LAB_003e487e;
    bVar11 = *pbVar17;
    if (bVar11 != 0x3b) break;
    pbVar17 = pbVar17 + 1;
    *ppPos = (char *)pbVar17;
  } while( true );
  if (bVar11 == 0x28) {
    uVar19 = (long)pbVar18 - (long)pcVar8;
    lVar16 = (long)pbVar15 - (long)pcVar6;
    pcVar8 = Scl_LibertyFindMatch((char *)pbVar17,pEnd);
    uVar14 = (ulong)(((int)pbVar17 - (int)p->pContents) + 1);
    lVar5 = (long)pcVar8 - (long)p->pContents;
    *ppPos = pcVar8 + 1;
    iVar4 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
    if (iVar4 != 0) {
      iVar4 = p->nItems;
      pSVar12 = p->pItems + iVar4;
      pSVar12->iLine = p->nLines;
      pSVar12->Type = 3;
      pSVar12->Next = -1;
      pSVar12->Child = -1;
      p->nItems = iVar4 + 1;
      (pSVar12->Key).Beg = (int)uVar19;
      (pSVar12->Key).End = (int)lVar16;
      SVar9 = Scl_LibertyUpdateHead(p,(Scl_Pair_t)(uVar14 | lVar5 << 0x20));
      pSVar12->Head = SVar9;
      return (int)((ulong)((long)pSVar12 - (long)p->pItems) >> 3) * -0x33333333;
    }
    pcVar8 = *ppPos;
    if (*pcVar8 == ';') {
      *ppPos = pcVar8 + 1;
    }
    else if (*pcVar8 == '{') {
      pcVar6 = Scl_LibertyFindMatch(pcVar8,pEnd);
      iVar4 = *(int *)&p->pContents;
      pSVar12 = p->pItems;
      iVar3 = p->nItems;
      lVar10 = (long)iVar3;
      pSVar12[lVar10].iLine = p->nLines;
      pSVar12[lVar10].Type = 1;
      pSVar12[lVar10].Next = -1;
      pSVar12[lVar10].Child = -1;
      p->nItems = iVar3 + 1;
      pSVar12[lVar10].Key.Beg = (int)uVar19;
      pSVar12[lVar10].Key.End = (int)lVar16;
      SVar9 = Scl_LibertyUpdateHead(p,(Scl_Pair_t)(uVar14 | lVar5 << 0x20));
      pSVar12[lVar10].Head = SVar9;
      pSVar12[lVar10].Body.Beg = ((int)pcVar8 - iVar4) + 1;
      pSVar12[lVar10].Body.End = (int)pcVar6 - iVar4;
      *ppPos = pcVar8 + 1;
      iVar4 = Scl_LibertyBuildItem(p,ppPos,pcVar6);
      pSVar12[lVar10].Child = iVar4;
      if (iVar4 != -1) {
        *ppPos = pcVar6 + 1;
        iVar4 = Scl_LibertyBuildItem(p,ppPos,pEnd);
        pSVar12[lVar10].Next = iVar4;
        if (iVar4 != -1) {
          return (int)((ulong)((long)pSVar12 + (lVar10 * 0x28 - (long)p->pItems)) >> 3) *
                 -0x33333333;
        }
      }
      goto LAB_003e4896;
    }
    pSVar12 = p->pItems;
    iVar4 = p->nItems;
    lVar10 = (long)iVar4;
    pSVar12[lVar10].iLine = p->nLines;
    pSVar12[lVar10].Type = 3;
  }
  else {
    if (bVar11 != 0x3a) {
LAB_003e487e:
      uVar19 = (long)pbVar18 - (long)pcVar8;
      lVar16 = (long)pbVar15 - (long)pcVar6;
      goto LAB_003e4896;
    }
    uVar19 = (long)pbVar18 - (long)pcVar8;
    lVar16 = (long)pbVar15 - (long)pcVar6;
    *ppPos = (char *)(pbVar17 + 1);
    iVar4 = Scl_LibertySkipSpaces(p,ppPos,pEnd,0);
    if (iVar4 != 0) goto LAB_003e4896;
    uVar14 = (long)*ppPos - (long)p->pContents;
    iVar4 = Scl_LibertySkipEntry(ppPos,pEnd);
    if (iVar4 != 0) goto LAB_003e4896;
    lVar5 = (long)*ppPos - (long)p->pContents;
    iVar4 = Scl_LibertySkipSpaces(p,ppPos,pEnd,1);
    if (iVar4 != 0) goto LAB_003e4896;
    cVar1 = **ppPos;
    if ((cVar1 != ';') && (cVar1 != '\n')) goto LAB_003e4896;
    *ppPos = *ppPos + 1;
    pSVar12 = p->pItems;
    iVar4 = p->nItems;
    lVar10 = (long)iVar4;
    pSVar12[lVar10].iLine = p->nLines;
    pSVar12[lVar10].Type = 2;
  }
  pSVar12[lVar10].Next = -1;
  pSVar12[lVar10].Child = -1;
  p->nItems = iVar4 + 1;
  pSVar12[lVar10].Key.Beg = (int)uVar19;
  pSVar12[lVar10].Key.End = (int)lVar16;
  SVar9 = Scl_LibertyUpdateHead(p,(Scl_Pair_t)(uVar14 & 0xffffffff | lVar5 << 0x20));
  pSVar12[lVar10].Head = SVar9;
  iVar4 = Scl_LibertyBuildItem(p,ppPos,pEnd);
  pSVar12[lVar10].Next = iVar4;
  if (iVar4 != -1) {
    return (int)((ulong)((long)pSVar12 + (lVar10 * 0x28 - (long)p->pItems)) >> 3) * -0x33333333;
  }
LAB_003e4896:
  if (p->pError == (char *)0x0) {
    pcVar6 = (char *)malloc(1000);
    p->pError = pcVar6;
    pcVar8 = p->pFileName;
    uVar2 = p->nLines;
    pcVar7 = Scl_LibertyReadString(p,(Scl_Pair_t)(uVar19 & 0xffffffff | lVar16 << 0x20));
    sprintf(pcVar6,"File \"%s\". Line %6d. Failed to parse entry \"%s\".\n",pcVar8,(ulong)uVar2,
            pcVar7);
  }
  return -1;
}

Assistant:

int Scl_LibertyBuildItem( Scl_Tree_t * p, char ** ppPos, char * pEnd )
{
    Scl_Item_t * pItem;
    Scl_Pair_t Key, Head, Body;
    char * pNext, * pStop;
    Key.End = 0;
    if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        return -2;
    Key.Beg = *ppPos - p->pContents;
    if ( Scl_LibertySkipEntry( ppPos, pEnd ) )
        goto exit;
    Key.End = *ppPos - p->pContents;
    if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        goto exit;
    pNext = *ppPos;
    if ( *pNext == ':' )
    {
        *ppPos = pNext + 1;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
            goto exit;
        Head.Beg = *ppPos - p->pContents;
        if ( Scl_LibertySkipEntry( ppPos, pEnd ) )
            goto exit;
        Head.End = *ppPos - p->pContents;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 1 ) )
            goto exit;
        pNext = *ppPos;
        if ( *pNext != ';' && *pNext != '\n' )
            goto exit;
        *ppPos = pNext + 1;
        // end of equation
        pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_EQUA );
        pItem->Key  = Key;
        pItem->Head = Scl_LibertyUpdateHead( p, Head );
        pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
        if ( pItem->Next == -1 )
            goto exit;
        return Scl_LibertyItemId( p, pItem );
    }
    if ( *pNext == '(' )
    {
        pStop = Scl_LibertyFindMatch( pNext, pEnd );
        Head.Beg = pNext - p->pContents + 1;
        Head.End = pStop - p->pContents;
        *ppPos = pStop + 1;
        if ( Scl_LibertySkipSpaces( p, ppPos, pEnd, 0 ) )
        {
            // end of list
            pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_LIST );
            pItem->Key  = Key;
            pItem->Head = Scl_LibertyUpdateHead( p, Head );
            return Scl_LibertyItemId( p, pItem );
        }
        pNext = *ppPos;
        if ( *pNext == '{' ) // beginning of body
        {
            pStop = Scl_LibertyFindMatch( pNext, pEnd );
            Body.Beg = pNext - p->pContents + 1;
            Body.End = pStop - p->pContents;
            // end of body
            pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_PROC );
            pItem->Key  = Key;
            pItem->Head = Scl_LibertyUpdateHead( p, Head );
            pItem->Body = Body;
            *ppPos = pNext + 1;
            pItem->Child = Scl_LibertyBuildItem( p, ppPos, pStop );
            if ( pItem->Child == -1 )
                goto exit;
            *ppPos = pStop + 1;
            pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
            if ( pItem->Next == -1 )
                goto exit;
            return Scl_LibertyItemId( p, pItem );
        }
        // end of list
        if ( *pNext == ';' )
            *ppPos = pNext + 1;
        pItem = Scl_LibertyNewItem( p, SCL_LIBERTY_LIST );
        pItem->Key  = Key;
        pItem->Head = Scl_LibertyUpdateHead( p, Head );
        pItem->Next = Scl_LibertyBuildItem( p, ppPos, pEnd );
        if ( pItem->Next == -1 )
            goto exit;
        return Scl_LibertyItemId( p, pItem );
    }
    if ( *pNext == ';' )
    {
        *ppPos = pNext + 1;
        return Scl_LibertyBuildItem(p, ppPos, pEnd);
    }
exit:
    if ( p->pError == NULL )
    {
        p->pError = ABC_ALLOC( char, 1000 );
        sprintf( p->pError, "File \"%s\". Line %6d. Failed to parse entry \"%s\".\n", 
            p->pFileName, p->nLines, Scl_LibertyReadString(p, Key) );
    }
    return -1;
}